

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

int __thiscall File::close(File *this,int __fd)

{
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:77:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:83:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  _Var1;
  File *pFVar2;
  Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:77:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:83:29)>
  local_10;
  
  local_10.super_anon_class_8_1_8991fb9c.this =
       (anon_class_8_1_8991fb9c)(anon_class_8_1_8991fb9c)this;
  _Var1 = std::
          visit<Visitor<File::close()::_lambda(std::filebuf&)_1_,File::close()::_lambda(std::streambuf*)_1_>,std::variant<std::streambuf*,std::filebuf>&>
                    (&local_10,&this->_file);
  pFVar2 = (File *)0x0;
  if (_Var1) {
    pFVar2 = this;
  }
  return (int)pFVar2;
}

Assistant:

File *close() {
		return std::visit(Visitor{[this](std::filebuf &file) {
			                          // This is called by the destructor, and an explicit `close`
			                          // shouldn't close twice.
			                          _file.emplace<std::streambuf *>(nullptr);
			                          return file.close() != nullptr;
		                          },
		                          [](std::streambuf *buf) { return buf != nullptr; }},
		                  _file)
		           ? this
		           : nullptr;
	}